

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O0

void repl(void)

{
  undefined1 auVar1 [16];
  string local_90 [48];
  unordered_map local_60 [8];
  context c;
  string s;
  
  std::__cxx11::string::string((string *)&c._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                   *)local_60);
  stdlib::init_stdlib(local_60);
  do {
    std::operator<<((ostream *)&std::cout,">>> ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&c._M_h._M_single_bucket);
    std::__cxx11::string::string(local_90,(string *)&c._M_h._M_single_bucket);
    auVar1 = parser::parse(local_90);
    eval::eval(auVar1._0_8_,(thing *)local_60,auVar1._8_8_);
    std::__cxx11::string::~string(local_90);
  } while( true );
}

Assistant:

void repl() {

  std::string s;
  context c;
  stdlib::init_stdlib(c);

  while (true) {

    std::cout << ">>> ";

    std::getline(std::cin, s);
    eval::eval(parser::parse(s), c);

  }

}